

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void CountUniqueBoardPositions<uttt::IBoard>(int depth)

{
  IBoard *this;
  pointer plVar1;
  int iVar2;
  uint uVar3;
  ostream *poVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  __node_base_ptr *pp_Var8;
  _Hash_node_base *p_Var9;
  pointer plVar10;
  __node_gen_type __node_gen;
  long m;
  unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
  unique_hashes;
  IBoard ng;
  unordered_set<uttt::IBoard,_std::hash<uttt::IBoard>,_std::equal_to<uttt::IBoard>,_std::allocator<uttt::IBoard>_>
  sets [2];
  int local_148;
  vector<long,_std::allocator<long>_> local_140;
  ulong local_128;
  long local_120;
  long local_118;
  size_t local_110;
  long local_108;
  _Hashtable<long_long,_long_long,_std::allocator<long_long>,_std::__detail::_Identity,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_100;
  undefined1 local_c8 [16];
  _Hash_node_base *local_b8;
  _Hashtable<uttt::IBoard,_uttt::IBoard,_std::allocator<uttt::IBoard>,_std::__detail::_Identity,_std::equal_to<uttt::IBoard>,_std::hash<uttt::IBoard>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_a8 [2];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Game size: ",0xb);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," bytes\n",7);
  lVar5 = 0x70;
  pp_Var8 = &local_a8[0]._M_single_bucket;
  do {
    ((_Hashtable<uttt::IBoard,_uttt::IBoard,_std::allocator<uttt::IBoard>,_std::__detail::_Identity,_std::equal_to<uttt::IBoard>,_std::hash<uttt::IBoard>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      *)(pp_Var8 + -6))->_M_buckets = pp_Var8;
    pp_Var8[-5] = (__node_base_ptr)0x1;
    ((__node_base *)(pp_Var8 + -4))->_M_nxt = (_Hash_node_base *)0x0;
    pp_Var8[-3] = (__node_base_ptr)0x0;
    ((_Prime_rehash_policy *)(pp_Var8 + -2))->_M_max_load_factor = 1.0;
    pp_Var8[-1] = (__node_base_ptr)0x0;
    *pp_Var8 = (__node_base_ptr)0x0;
    pp_Var8 = pp_Var8 + 7;
    lVar5 = lVar5 + -0x38;
  } while (lVar5 != 0);
  uttt::IBoard::IBoard((IBoard *)&local_100);
  local_140.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)local_a8;
  std::
  _Hashtable<uttt::IBoard,uttt::IBoard,std::allocator<uttt::IBoard>,std::__detail::_Identity,std::equal_to<uttt::IBoard>,std::hash<uttt::IBoard>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_insert<uttt::IBoard_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<uttt::IBoard,true>>>>
            ((_Hashtable<uttt::IBoard,uttt::IBoard,std::allocator<uttt::IBoard>,std::__detail::_Identity,std::equal_to<uttt::IBoard>,std::hash<uttt::IBoard>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)local_140.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start,&local_100);
  if (0 < depth) {
    uVar3 = 0;
    lVar5 = 1;
    local_148 = 0;
    do {
      local_100._M_buckets = &local_100._M_single_bucket;
      local_100._M_bucket_count = 1;
      local_100._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_100._M_element_count = 0;
      local_100._M_rehash_policy._M_max_load_factor = 1.0;
      local_100._M_rehash_policy._M_next_resize = 0;
      local_100._M_single_bucket = (__node_base_ptr)0x0;
      local_118 = lVar5;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Working on depth: ",0x12);
      local_148 = local_148 + 1;
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_148);
      local_140.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT71(local_140.super__Vector_base<long,_std::allocator<long>_>._M_impl
                                   .super__Vector_impl_data._M_start._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_140,1);
      uVar6 = (ulong)(1 - uVar3);
      local_128 = uVar6;
      std::
      _Hashtable<uttt::IBoard,_uttt::IBoard,_std::allocator<uttt::IBoard>,_std::__detail::_Identity,_std::equal_to<uttt::IBoard>,_std::hash<uttt::IBoard>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::clear(local_a8 + uVar6);
      local_120 = std::chrono::_V2::system_clock::now();
      for (p_Var9 = local_a8[uVar3]._M_before_begin._M_nxt; p_Var9 != (_Hash_node_base *)0x0;
          p_Var9 = p_Var9->_M_nxt) {
        this = (IBoard *)(p_Var9 + 1);
        iVar2 = uttt::IBoard::GetStatus(this);
        if (iVar2 == -1) {
          uttt::IBoard::GetPossibleMoves(&local_140,this);
          plVar1 = local_140.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          for (plVar10 = local_140.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_start; plVar10 != plVar1; plVar10 = plVar10 + 1)
          {
            local_108 = *plVar10;
            local_b8 = p_Var9[3]._M_nxt;
            local_c8._0_4_ = this->macro;
            local_c8._4_2_ = (this->micro)._M_elems[0];
            local_c8._6_2_ = (this->micro)._M_elems[1];
            local_c8._8_8_ = p_Var9[2]._M_nxt;
            uttt::IBoard::ApplyMove((IBoard *)local_c8,&local_108);
            std::
            _Hashtable<uttt::IBoard,uttt::IBoard,std::allocator<uttt::IBoard>,std::__detail::_Identity,std::equal_to<uttt::IBoard>,std::hash<uttt::IBoard>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::_M_emplace<uttt::IBoard&>
                      ((_Hashtable<uttt::IBoard,uttt::IBoard,std::allocator<uttt::IBoard>,std::__detail::_Identity,std::equal_to<uttt::IBoard>,std::hash<uttt::IBoard>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)(local_a8 + uVar6),(IBoard *)local_c8);
            local_110 = uttt::IBoard::Hash((IBoard *)local_c8);
            std::
            _Hashtable<long_long,_long_long,_std::allocator<long_long>,_std::__detail::_Identity,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::_M_emplace<unsigned_long>(&local_100,&local_110);
          }
          if (local_140.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_140.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
        }
      }
      lVar7 = std::chrono::_V2::system_clock::now();
      lVar7 = lVar7 - local_120;
      lVar5 = local_118 + local_a8[uVar6]._M_element_count;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Current depth hash count: ",0x1a);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," / ",3);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
      poVar4 = std::ostream::_M_insert<double>
                         (((((double)CONCAT44(0x45300000,(int)(local_100._M_element_count >> 0x20))
                            - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)local_100._M_element_count) -
                           4503599627370496.0)) * 100.0) /
                          (((double)CONCAT44(0x45300000,
                                             (int)(local_a8[uVar6]._M_element_count >> 0x20)) -
                           1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)local_a8[uVar6]._M_element_count) -
                          4503599627370496.0)));
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"%\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Current depth node count: ",0x1a);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,", size: ",8);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"MB\n",3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Current depth duration  : ",0x1a);
      poVar4 = std::ostream::_M_insert<long>((long)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," seconds ",9);
      poVar4 = std::ostream::_M_insert<long>((long)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," milliseconds, ",0xf);
      poVar4 = std::ostream::_M_insert<double>
                         (((((double)CONCAT44(0x45300000,
                                              (int)(local_a8[uVar6]._M_element_count >> 0x20)) -
                            1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)local_a8[uVar6]._M_element_count) -
                           4503599627370496.0)) / (double)(lVar7 / 1000000)) * 1000.0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," nps\n",5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Total count             : ",0x1a);
      poVar4 = std::ostream::_M_insert<long_long>((longlong)&std::cout);
      local_140.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT71(local_140.super__Vector_base<long,_std::allocator<long>_>._M_impl
                                   .super__Vector_impl_data._M_start._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_140,1);
      std::
      _Hashtable<long_long,_long_long,_std::allocator<long_long>,_std::__detail::_Identity,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&local_100);
      uVar3 = (uint)local_128;
    } while (local_148 != depth);
  }
  lVar5 = 0x38;
  do {
    std::
    _Hashtable<uttt::IBoard,_uttt::IBoard,_std::allocator<uttt::IBoard>,_std::__detail::_Identity,_std::equal_to<uttt::IBoard>,_std::hash<uttt::IBoard>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<uttt::IBoard,_uttt::IBoard,_std::allocator<uttt::IBoard>,_std::__detail::_Identity,_std::equal_to<uttt::IBoard>,_std::hash<uttt::IBoard>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)((long)&local_a8[0]._M_buckets + lVar5));
    lVar5 = lVar5 + -0x38;
  } while (lVar5 != -0x38);
  return;
}

Assistant:

void
CountUniqueBoardPositions(int depth)
{
    std::cout << "Game size: " << sizeof(IGame) << " bytes\n";
    long long total = 1;
    std::unordered_set<IGame> sets[2];
    sets[0].insert({{}});
    int set_ind = 0;
    for (int i = 0; i < depth; ++i)
    {
        std::unordered_set<long long> unique_hashes;
        std::cout << "Working on depth: " << i + 1 << '\n';
        sets[1 - set_ind].clear();
        auto t1 = std::chrono::high_resolution_clock::now();
        for (const auto &g : sets[set_ind])
        {
            if (g.GetStatus() != game::Undecided)
                continue;
            auto moves = g.GetPossibleMoves();
            for (auto m : moves)
            {
                auto ng = g;
                ng.ApplyMove(m);
                sets[1 - set_ind].emplace(ng);
                unique_hashes.emplace(ng.Hash());
            }
        }
        auto t2 = std::chrono::high_resolution_clock::now();
        auto millis = std::chrono::duration_cast<std::chrono::milliseconds>(t2 - t1).count();
        total += sets[1 - set_ind].size();
        std::cout << "Current depth hash count: " << unique_hashes.size() << " / " << sets[1 - set_ind].size() << " = " << double(unique_hashes.size()) * 100.0 / sets[1 - set_ind].size() << "%\n";
        std::cout << "Current depth node count: " << sets[1 - set_ind].size() << ", size: " << sets[1 - set_ind].size() * sizeof(IGame) / (1 << 20) << "MB\n";
        std::cout << "Current depth duration  : " << millis / 1000 << " seconds " << millis % 1000 << " milliseconds, " << double(sets[1 - set_ind].size()) / millis * 1000 << " nps\n";
        std::cout << "Total count             : " << total << '\n';
        set_ind = 1 - set_ind;
    }
}